

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O1

RPCHelpMan * decodescript(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_13;
  RPCArgOptions opts;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  RPCHelpMan *in_RDI;
  long lVar11;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff038;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffff03c;
  undefined8 in_stack_fffffffffffff048;
  undefined8 in_stack_fffffffffffff050;
  undefined8 in_stack_fffffffffffff058;
  code *pcVar13;
  undefined8 in_stack_fffffffffffff060;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff068;
  pointer in_stack_fffffffffffff078;
  pointer pRVar14;
  pointer in_stack_fffffffffffff080;
  pointer pRVar15;
  pointer in_stack_fffffffffffff088;
  pointer pRVar16;
  undefined8 in_stack_fffffffffffff090;
  pointer in_stack_fffffffffffff098;
  pointer pRVar17;
  pointer in_stack_fffffffffffff0a0;
  pointer pRVar18;
  pointer in_stack_fffffffffffff0a8;
  pointer pRVar19;
  undefined8 in_stack_fffffffffffff0b0;
  pointer in_stack_fffffffffffff0b8;
  pointer pRVar20;
  pointer in_stack_fffffffffffff0c0;
  pointer pRVar21;
  pointer in_stack_fffffffffffff0c8;
  undefined8 in_stack_fffffffffffff0d0;
  pointer in_stack_fffffffffffff0d8;
  pointer in_stack_fffffffffffff0e0;
  pointer in_stack_fffffffffffff0e8;
  undefined8 in_stack_fffffffffffff0f0;
  pointer in_stack_fffffffffffff0f8;
  pointer in_stack_fffffffffffff100;
  pointer in_stack_fffffffffffff108;
  undefined8 in_stack_fffffffffffff110;
  pointer in_stack_fffffffffffff118;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ed0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_eb8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_e20;
  RPCResults local_e08;
  allocator_type local_de9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_de8;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  ulong *local_d10;
  undefined8 local_d08;
  ulong local_d00;
  undefined8 uStack_cf8;
  ulong *local_cf0;
  size_type local_ce8;
  ulong local_ce0;
  undefined8 uStack_cd8;
  long *local_cd0 [2];
  long local_cc0 [2];
  long *local_cb0 [2];
  long local_ca0 [2];
  long *local_c90 [2];
  long local_c80 [2];
  long *local_c70 [2];
  long local_c60 [2];
  long *local_c50 [2];
  long local_c40 [2];
  long *local_c30 [2];
  long local_c20 [2];
  long *local_c10 [2];
  long local_c00 [2];
  long *local_bf0 [2];
  long local_be0 [2];
  long *local_bd0 [2];
  long local_bc0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_bb0;
  long *local_b90 [2];
  long local_b80 [2];
  pointer local_b70 [2];
  undefined1 local_b60 [152];
  RPCResult local_ac8;
  RPCResult local_a40;
  RPCResult local_9b8;
  RPCResult local_930;
  RPCResult local_8a8;
  long *local_820 [2];
  long local_810 [2];
  long *local_800 [2];
  long local_7f0 [2];
  long *local_7e0 [2];
  long local_7d0 [2];
  long *local_7c0 [2];
  long local_7b0 [2];
  long *local_7a0 [2];
  long local_790 [2];
  long *local_780 [2];
  long local_770 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  size_type *local_720;
  size_type local_718;
  size_type local_710;
  undefined8 uStack_708;
  long *local_700 [2];
  long local_6f0 [2];
  long *local_6e0 [2];
  long local_6d0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_6c0;
  long *local_6a0 [2];
  long local_690 [2];
  pointer local_680 [2];
  undefined1 local_670 [152];
  RPCResult local_5d8;
  RPCResult local_550;
  RPCResult local_4c8;
  RPCResult local_440;
  RPCResult local_3b8;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"decodescript","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nDecode a hex-encoded script.\n","");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"hexstring","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"the hex-encoded script","");
  local_260 = &local_250;
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff038;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  name.field_2._8_8_ = in_stack_fffffffffffff050;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff060;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff058;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff068;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff078;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff080;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff088;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff090;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff098;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff0a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff0a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff0b0;
  description_13._M_string_length = (size_type)in_stack_fffffffffffff0c0;
  description_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0b8;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff0c8;
  description_13.field_2._8_8_ = in_stack_fffffffffffff0d0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff0e0;
  opts._0_8_ = in_stack_fffffffffffff0d8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff0e8;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff0f0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff0f8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff100;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff108;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff110;
  opts._64_8_ = in_stack_fffffffffffff118;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_13,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_de8,__l,&local_de9);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_680[0] = (pointer)local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"asm","");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a0,"Disassembly of the script","");
  local_e38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff038;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff050;
  description._M_string_length = in_stack_fffffffffffff060;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description.field_2 = in_stack_fffffffffffff068;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff080;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff078;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult
            ((RPCResult *)(local_670 + 0x10),STR,m_key_name,description,inner,SUB81(local_680,0));
  local_6c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_6c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"desc","");
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e0,"Inferred descriptor for the script","");
  local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff038;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff050;
  description_00._M_string_length = in_stack_fffffffffffff060;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_00.field_2 = in_stack_fffffffffffff068;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult(&local_5d8,STR,m_key_name_00,description_00,inner_00,SUB81(&local_6c0,0));
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"type","");
  GetAllOutputTypes_abi_cxx11_();
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_760,0,0,"The output type (e.g. ",0x16);
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if (paVar9 == paVar8) {
    local_740.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_740.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_740.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_740._M_dataplus._M_p = (pointer)paVar9;
  }
  local_740._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_740,")");
  local_720 = &local_710;
  psVar1 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar9) {
    local_710 = paVar9->_M_allocated_capacity;
    uStack_708 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_710 = paVar9->_M_allocated_capacity;
    local_720 = psVar1;
  }
  local_718 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff038;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff050;
  description_01._M_string_length = in_stack_fffffffffffff060;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_01.field_2 = in_stack_fffffffffffff068;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult(&local_550,STR,m_key_name_01,description_01,inner_01,false);
  local_780[0] = local_770;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"address","");
  local_7a0[0] = local_790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a0,"The Bitcoin address (only if a well-defined address exists)","");
  local_e98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_fffffffffffff03c;
  auVar3._12_8_ = in_stack_fffffffffffff048;
  auVar3._20_8_ = in_stack_fffffffffffff050;
  auVar3._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff060;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_02.field_2 = in_stack_fffffffffffff068;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult
            (&local_4c8,STR,(string)(auVar3 << 0x20),SUB81(local_780,0),description_02,inner_02,true
            );
  local_7c0[0] = local_7b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"p2sh","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e0,
             "address of P2SH script wrapping this redeem script (not returned for types that should not be wrapped)"
             ,"");
  local_eb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_eb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_eb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar12 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_fffffffffffff03c;
  auVar4._12_8_ = in_stack_fffffffffffff048;
  auVar4._20_8_ = in_stack_fffffffffffff050;
  auVar4._28_4_ = 0;
  description_03._M_string_length = in_stack_fffffffffffff060;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_03.field_2 = in_stack_fffffffffffff068;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult
            (&local_440,STR,(string)(auVar4 << 0x20),SUB81(local_7c0,0),description_03,inner_03,true
            );
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"segwit","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_820,
             "Result of a witness output script wrapping this redeem script (not returned for types that should not be wrapped)"
             ,"");
  local_b70[0] = (pointer)local_b60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"asm","");
  local_b90[0] = local_b80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b90,"Disassembly of the output script","");
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff050;
  description_04._M_string_length = in_stack_fffffffffffff060;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_04.field_2 = in_stack_fffffffffffff068;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult
            ((RPCResult *)(local_b60 + 0x10),STR,m_key_name_02,description_04,inner_04,
             SUB81(local_b70,0));
  local_bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"hex","");
  local_bd0[0] = local_bc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bd0,"The raw output script bytes, hex-encoded","");
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff050;
  description_05._M_string_length = in_stack_fffffffffffff060;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_05.field_2 = in_stack_fffffffffffff068;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult(&local_ac8,STR_HEX,m_key_name_03,description_05,inner_05,SUB81(&local_bb0,0))
  ;
  local_bf0[0] = local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"type","");
  local_c10[0] = local_c00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c10,
             "The type of the output script (e.g. witness_v0_keyhash or witness_v0_scripthash)","");
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff050;
  description_06._M_string_length = in_stack_fffffffffffff060;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_06.field_2 = in_stack_fffffffffffff068;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult(&local_a40,STR,m_key_name_04,description_06,inner_06,SUB81(local_bf0,0));
  local_c30[0] = local_c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"address","");
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c50,"The Bitcoin address (only if a well-defined address exists)","");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  uVar12 = 0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_fffffffffffff03c;
  auVar5._12_8_ = in_stack_fffffffffffff048;
  auVar5._20_8_ = in_stack_fffffffffffff050;
  auVar5._28_4_ = 0;
  description_07._M_string_length = in_stack_fffffffffffff060;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_07.field_2 = in_stack_fffffffffffff068;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult
            (&local_9b8,STR,(string)(auVar5 << 0x20),SUB81(local_c30,0),description_07,inner_07,true
            );
  local_c70[0] = local_c60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c70,"desc","");
  local_c90[0] = local_c80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c90,"Inferred descriptor for the script","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff050;
  description_08._M_string_length = in_stack_fffffffffffff060;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_08.field_2 = in_stack_fffffffffffff068;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff080;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff078;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff088;
  RPCResult::RPCResult(&local_930,STR,m_key_name_05,description_08,inner_08,SUB81(local_c70,0));
  local_cb0[0] = local_ca0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cb0,"p2sh-segwit","");
  local_cd0[0] = local_cc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cd0,"address of the P2SH script wrapping this witness redeem script",""
            );
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff050;
  description_09._M_string_length = in_stack_fffffffffffff060;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_09.field_2._M_local_buf = in_stack_fffffffffffff068._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_8a8,STR,m_key_name_06,description_09,inner_09,SUB81(local_cb0,0));
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)(local_b60 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_ed0,__l_00,(allocator_type *)&stack0xfffffffffffff077);
  uVar12 = 0;
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = in_stack_fffffffffffff03c;
  auVar6._12_8_ = in_stack_fffffffffffff048;
  auVar6._20_8_ = in_stack_fffffffffffff050;
  auVar6._28_4_ = 0;
  description_10._M_string_length = in_stack_fffffffffffff060;
  description_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_10.field_2._M_local_buf = in_stack_fffffffffffff068._M_local_buf;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar15;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  RPCResult::RPCResult(&local_3b8,OBJ,(string)(auVar6 << 0x20),false,description_10,inner_10,true);
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)(local_670 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_e20,__l_01,(allocator_type *)&stack0xfffffffffffff076);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff03c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff048;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff050;
  description_11._M_string_length = in_stack_fffffffffffff060;
  description_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff058;
  description_11.field_2 = in_stack_fffffffffffff068;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar15;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_07,description_11,inner_11,SUB81(local_310,0));
  result._4_4_ = in_stack_fffffffffffff03c;
  result.m_type = uVar12;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff048;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff050;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff058;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff060;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff068;
  result._64_8_ = pRVar14;
  result.m_description._M_dataplus._M_p = (pointer)pRVar15;
  result.m_description._M_string_length = (size_type)pRVar16;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff090;
  result.m_description.field_2._8_8_ = pRVar17;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar18;
  result.m_cond._M_string_length = (size_type)pRVar19;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff0b0;
  result.m_cond.field_2._8_8_ = pRVar20;
  RPCResults::RPCResults(&local_e08,result);
  local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d50,"decodescript","");
  local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d70,"\"hexstring\"","");
  HelpExampleCli(&local_d30,&local_d50,&local_d70);
  local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_db0,"decodescript","");
  local_dd0._M_dataplus._M_p = (pointer)&local_dd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd0,"\"hexstring\"","");
  HelpExampleRpc(&local_d90,&local_db0,&local_dd0);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
    uVar10 = local_d30.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_d90._M_string_length + local_d30._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
      uVar10 = local_d90.field_2._M_allocated_capacity;
    }
    if (local_d90._M_string_length + local_d30._M_string_length <= (ulong)uVar10) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d90,0,0,local_d30._M_dataplus._M_p,local_d30._M_string_length);
      goto LAB_00a815e2;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d30,local_d90._M_dataplus._M_p,local_d90._M_string_length);
LAB_00a815e2:
  local_d10 = &local_d00;
  puVar2 = (ulong *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar9) {
    local_d00 = paVar9->_M_allocated_capacity;
    uStack_cf8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d00 = paVar9->_M_allocated_capacity;
    local_d10 = puVar2;
  }
  local_ce8 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
  if (local_d10 == &local_d00) {
    uStack_cd8 = uStack_cf8;
    local_cf0 = &local_ce0;
  }
  else {
    local_cf0 = local_d10;
  }
  local_ce0 = local_d00;
  local_d08 = 0;
  local_d00 = local_d00 & 0xffffffffffffff00;
  pcVar13 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:536:9)>
            ::_M_manager;
  description_12._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:536:9)>
       ::_M_invoke;
  description_12._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:536:9)>
                ::_M_manager;
  description_12.field_2 = in_stack_fffffffffffff068;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar15;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar14;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff090;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar18;
  examples.m_examples._M_string_length = in_stack_fffffffffffff0b0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar19;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar20;
  examples.m_examples.field_2._8_8_ = pRVar21;
  local_d10 = &local_d00;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff048)),description_12,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar13 != (code *)0x0) {
    (*pcVar13)(&stack0xfffffffffffff048,&stack0xfffffffffffff048,3);
  }
  if (local_cf0 != &local_ce0) {
    operator_delete(local_cf0,local_ce0 + 1);
  }
  if (local_d10 != &local_d00) {
    operator_delete(local_d10,local_d00 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
    operator_delete(local_d90._M_dataplus._M_p,local_d90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
    operator_delete(local_dd0._M_dataplus._M_p,local_dd0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
    operator_delete(local_db0._M_dataplus._M_p,local_db0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
    operator_delete(local_d30._M_dataplus._M_p,local_d30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
    operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
    operator_delete(local_d50._M_dataplus._M_p,local_d50.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e08.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e20);
  lVar11 = 0x330;
  do {
    if ((long *)(local_670 + lVar11) != *(long **)((long)local_680 + lVar11)) {
      operator_delete(*(long **)((long)local_680 + lVar11),*(long *)(local_670 + lVar11) + 1);
    }
    if ((long *)((long)local_690 + lVar11) != *(long **)((long)local_6a0 + lVar11)) {
      operator_delete(*(long **)((long)local_6a0 + lVar11),*(long *)((long)local_690 + lVar11) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_6c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar11));
    if ((long *)((long)local_6d0 + lVar11) != *(long **)((long)local_6e0 + lVar11)) {
      operator_delete(*(long **)((long)local_6e0 + lVar11),*(long *)((long)local_6d0 + lVar11) + 1);
    }
    lVar11 = lVar11 + -0x88;
  } while (lVar11 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ed0);
  lVar11 = 0x330;
  do {
    if ((long *)(local_b60 + lVar11) != *(long **)((long)local_b70 + lVar11)) {
      operator_delete(*(long **)((long)local_b70 + lVar11),*(long *)(local_b60 + lVar11) + 1);
    }
    if ((long *)((long)local_b80 + lVar11) != *(long **)((long)local_b90 + lVar11)) {
      operator_delete(*(long **)((long)local_b90 + lVar11),*(long *)((long)local_b80 + lVar11) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar11));
    if ((long *)((long)local_bc0 + lVar11) != *(long **)((long)local_bd0 + lVar11)) {
      operator_delete(*(long **)((long)local_bd0 + lVar11),*(long *)((long)local_bc0 + lVar11) + 1);
    }
    lVar11 = lVar11 + -0x88;
  } while (lVar11 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff078);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  if (local_cb0[0] != local_ca0) {
    operator_delete(local_cb0[0],local_ca0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff098);
  if (local_c90[0] != local_c80) {
    operator_delete(local_c90[0],local_c80[0] + 1);
  }
  if (local_c70[0] != local_c60) {
    operator_delete(local_c70[0],local_c60[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0b8);
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0],local_c40[0] + 1);
  }
  if (local_c30[0] != local_c20) {
    operator_delete(local_c30[0],local_c20[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0d8);
  if (local_c10[0] != local_c00) {
    operator_delete(local_c10[0],local_c00[0] + 1);
  }
  if (local_bf0[0] != local_be0) {
    operator_delete(local_bf0[0],local_be0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff0f8);
  if (local_bd0[0] != local_bc0) {
    operator_delete(local_bd0[0],local_bc0[0] + 1);
  }
  if (local_bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_bb0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_bb0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff118);
  if (local_b90[0] != local_b80) {
    operator_delete(local_b90[0],local_b80[0] + 1);
  }
  if (local_b70[0] != (pointer)local_b60) {
    operator_delete(local_b70[0],local_b60._0_8_ + 1);
  }
  if (local_820[0] != local_810) {
    operator_delete(local_820[0],local_810[0] + 1);
  }
  if (local_800[0] != local_7f0) {
    operator_delete(local_800[0],local_7f0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_eb8);
  if (local_7e0[0] != local_7d0) {
    operator_delete(local_7e0[0],local_7d0[0] + 1);
  }
  if (local_7c0[0] != local_7b0) {
    operator_delete(local_7c0[0],local_7b0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e98);
  if (local_7a0[0] != local_790) {
    operator_delete(local_7a0[0],local_790[0] + 1);
  }
  if (local_780[0] != local_770) {
    operator_delete(local_780[0],local_770[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e78);
  if (local_720 != &local_710) {
    operator_delete(local_720,local_710 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e58);
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0],local_6d0[0] + 1);
  }
  if (local_6c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_6c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_6c0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_6c0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_e38);
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  if (local_680[0] != (pointer)local_670) {
    operator_delete(local_680[0],local_670._0_8_ + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_de8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan decodescript()
{
    return RPCHelpMan{
        "decodescript",
        "\nDecode a hex-encoded script.\n",
        {
            {"hexstring", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "the hex-encoded script"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "asm", "Disassembly of the script"},
                {RPCResult::Type::STR, "desc", "Inferred descriptor for the script"},
                {RPCResult::Type::STR, "type", "The output type (e.g. " + GetAllOutputTypes() + ")"},
                {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                {RPCResult::Type::STR, "p2sh", /*optional=*/true,
                 "address of P2SH script wrapping this redeem script (not returned for types that should not be wrapped)"},
                {RPCResult::Type::OBJ, "segwit", /*optional=*/true,
                 "Result of a witness output script wrapping this redeem script (not returned for types that should not be wrapped)",
                 {
                     {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
                     {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
                     {RPCResult::Type::STR, "type", "The type of the output script (e.g. witness_v0_keyhash or witness_v0_scripthash)"},
                     {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
                     {RPCResult::Type::STR, "desc", "Inferred descriptor for the script"},
                     {RPCResult::Type::STR, "p2sh-segwit", "address of the P2SH script wrapping this witness redeem script"},
                 }},
            },
        },
        RPCExamples{
            HelpExampleCli("decodescript", "\"hexstring\"")
          + HelpExampleRpc("decodescript", "\"hexstring\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue r(UniValue::VOBJ);
    CScript script;
    if (request.params[0].get_str().size() > 0){
        std::vector<unsigned char> scriptData(ParseHexV(request.params[0], "argument"));
        script = CScript(scriptData.begin(), scriptData.end());
    } else {
        // Empty scripts are valid
    }
    ScriptToUniv(script, /*out=*/r, /*include_hex=*/false, /*include_address=*/true);

    std::vector<std::vector<unsigned char>> solutions_data;
    const TxoutType which_type{Solver(script, solutions_data)};

    const bool can_wrap{[&] {
        switch (which_type) {
        case TxoutType::MULTISIG:
        case TxoutType::NONSTANDARD:
        case TxoutType::PUBKEY:
        case TxoutType::PUBKEYHASH:
        case TxoutType::WITNESS_V0_KEYHASH:
        case TxoutType::WITNESS_V0_SCRIPTHASH:
            // Can be wrapped if the checks below pass
            break;
        case TxoutType::NULL_DATA:
        case TxoutType::SCRIPTHASH:
        case TxoutType::WITNESS_UNKNOWN:
        case TxoutType::WITNESS_V1_TAPROOT:
        case TxoutType::ANCHOR:
            // Should not be wrapped
            return false;
        } // no default case, so the compiler can warn about missing cases
        if (!script.HasValidOps() || script.IsUnspendable()) {
            return false;
        }
        for (CScript::const_iterator it{script.begin()}; it != script.end();) {
            opcodetype op;
            CHECK_NONFATAL(script.GetOp(it, op));
            if (op == OP_CHECKSIGADD || IsOpSuccess(op)) {
                return false;
            }
        }
        return true;
    }()};

    if (can_wrap) {
        r.pushKV("p2sh", EncodeDestination(ScriptHash(script)));
        // P2SH and witness programs cannot be wrapped in P2WSH, if this script
        // is a witness program, don't return addresses for a segwit programs.
        const bool can_wrap_P2WSH{[&] {
            switch (which_type) {
            case TxoutType::MULTISIG:
            case TxoutType::PUBKEY:
            // Uncompressed pubkeys cannot be used with segwit checksigs.
            // If the script contains an uncompressed pubkey, skip encoding of a segwit program.
                for (const auto& solution : solutions_data) {
                    if ((solution.size() != 1) && !CPubKey(solution).IsCompressed()) {
                        return false;
                    }
                }
                return true;
            case TxoutType::NONSTANDARD:
            case TxoutType::PUBKEYHASH:
                // Can be P2WSH wrapped
                return true;
            case TxoutType::NULL_DATA:
            case TxoutType::SCRIPTHASH:
            case TxoutType::WITNESS_UNKNOWN:
            case TxoutType::WITNESS_V0_KEYHASH:
            case TxoutType::WITNESS_V0_SCRIPTHASH:
            case TxoutType::WITNESS_V1_TAPROOT:
            case TxoutType::ANCHOR:
                // Should not be wrapped
                return false;
            } // no default case, so the compiler can warn about missing cases
            NONFATAL_UNREACHABLE();
        }()};
        if (can_wrap_P2WSH) {
            UniValue sr(UniValue::VOBJ);
            CScript segwitScr;
            FlatSigningProvider provider;
            if (which_type == TxoutType::PUBKEY) {
                segwitScr = GetScriptForDestination(WitnessV0KeyHash(Hash160(solutions_data[0])));
            } else if (which_type == TxoutType::PUBKEYHASH) {
                segwitScr = GetScriptForDestination(WitnessV0KeyHash(uint160{solutions_data[0]}));
            } else {
                // Scripts that are not fit for P2WPKH are encoded as P2WSH.
                provider.scripts[CScriptID(script)] = script;
                segwitScr = GetScriptForDestination(WitnessV0ScriptHash(script));
            }
            ScriptToUniv(segwitScr, /*out=*/sr, /*include_hex=*/true, /*include_address=*/true, /*provider=*/&provider);
            sr.pushKV("p2sh-segwit", EncodeDestination(ScriptHash(segwitScr)));
            r.pushKV("segwit", std::move(sr));
        }
    }

    return r;
},
    };
}